

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_get_argument_property
              (p_ply_argument argument,p_ply_property_conflict *property,long *length,
              long *value_index)

{
  long *value_index_local;
  long *length_local;
  p_ply_property_conflict *property_local;
  p_ply_argument argument_local;
  int local_4;
  
  if (argument == (p_ply_argument)0x0) {
    local_4 = 0;
  }
  else {
    if (property != (p_ply_property_conflict *)0x0) {
      *property = argument->property;
    }
    if (length != (long *)0x0) {
      *length = argument->length;
    }
    if (value_index != (long *)0x0) {
      *value_index = argument->value_index;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int ply_get_argument_property(p_ply_argument argument, p_ply_property *property,
                              long *length, long *value_index) {
    assert(argument);
    if (!argument) return 0;
    if (property) *property = argument->property;
    if (length) *length = argument->length;
    if (value_index) *value_index = argument->value_index;
    return 1;
}